

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

void __thiscall
FxMinMax::FxMinMax(FxMinMax *this,TArray<FxExpression_*,_FxExpression_*> *expr,FName *type,
                  FScriptPosition *pos)

{
  FxExpression *pFVar1;
  bool bVar2;
  uint uVar3;
  FxExpression **ppFVar4;
  bool local_56;
  uint local_38;
  uint i;
  FScriptPosition *pos_local;
  FName *type_local;
  TArray<FxExpression_*,_FxExpression_*> *expr_local;
  FxMinMax *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxMinMax_00b89e58;
  TDeletingArray<FxExpression_*,_FxExpression_*>::TDeletingArray(&this->choices);
  FName::FName(&this->Type,type);
  uVar3 = TArray<FxExpression_*,_FxExpression_*>::Size(expr);
  if (uVar3 == 0) {
    __assert_fail("expr.Size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x9c4,
                  "FxMinMax::FxMinMax(TArray<FxExpression *> &, FName, const FScriptPosition &)");
  }
  bVar2 = FName::operator==(type,NAME_Min);
  local_56 = true;
  if (!bVar2) {
    local_56 = FName::operator==(type,NAME_Max);
  }
  if (local_56 == false) {
    __assert_fail("type == NAME_Min || type == NAME_Max",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x9c5,
                  "FxMinMax::FxMinMax(TArray<FxExpression *> &, FName, const FScriptPosition &)");
  }
  uVar3 = TArray<FxExpression_*,_FxExpression_*>::Size(expr);
  TArray<FxExpression_*,_FxExpression_*>::Resize
            (&(this->choices).super_TArray<FxExpression_*,_FxExpression_*>,uVar3);
  local_38 = 0;
  while( true ) {
    uVar3 = TArray<FxExpression_*,_FxExpression_*>::Size(expr);
    if (uVar3 <= local_38) break;
    ppFVar4 = TArray<FxExpression_*,_FxExpression_*>::operator[](expr,(ulong)local_38);
    pFVar1 = *ppFVar4;
    ppFVar4 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                        (&(this->choices).super_TArray<FxExpression_*,_FxExpression_*>,
                         (ulong)local_38);
    *ppFVar4 = pFVar1;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

FxMinMax::FxMinMax(TArray<FxExpression*> &expr, FName type, const FScriptPosition &pos)
: FxExpression(pos), Type(type)
{
	assert(expr.Size() > 0);
	assert(type == NAME_Min || type == NAME_Max);

	choices.Resize(expr.Size());
	for (unsigned i = 0; i < expr.Size(); ++i)
	{
		choices[i] = expr[i];
	}
}